

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O3

static_codebook * vorbis_staticbook_unpack(oggpack_buffer *opb)

{
  char cVar1;
  int iVar2;
  int iVar3;
  static_codebook *b;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long *plVar9;
  size_t sVar10;
  
  b = (static_codebook *)calloc(1,0x48);
  b->allocedp = 1;
  lVar4 = oggpack_read(opb,0x18);
  if (lVar4 == 0x564342) {
    lVar4 = oggpack_read(opb,0x10);
    b->dim = lVar4;
    lVar4 = oggpack_read(opb,0x18);
    b->entries = lVar4;
    if (lVar4 != -1) {
      iVar2 = ov_ilog((ogg_uint32_t)b->dim);
      iVar3 = ov_ilog((ogg_uint32_t)b->entries);
      if (iVar3 + iVar2 < 0x19) {
        lVar4 = oggpack_read(opb,1);
        if ((int)lVar4 == 1) {
          lVar4 = oggpack_read(opb,5);
          lVar4 = lVar4 + 1;
          if (lVar4 == 0) goto LAB_001d8fb8;
          sVar10 = b->entries;
          pcVar7 = (char *)malloc(sVar10);
          b->lengthlist = pcVar7;
          if (0 < (long)sVar10) {
            lVar8 = 0;
            do {
              iVar2 = ov_ilog((int)sVar10 - (int)lVar8);
              lVar5 = oggpack_read(opb,iVar2);
              if (((lVar5 == -1) || (0x20 < lVar4)) ||
                 (sVar10 = b->entries, (long)(sVar10 - lVar8) < lVar5)) goto LAB_001d8fb8;
              if (0 < lVar5) {
                if (1 < lVar5 - 1U >> ((char)lVar4 - 1U & 0x3f)) goto LAB_001d8fb8;
                lVar6 = lVar5 + lVar8;
                do {
                  b->lengthlist[lVar8] = (char)lVar4;
                  lVar8 = lVar8 + 1;
                  lVar5 = lVar5 + -1;
                } while (lVar5 != 0);
                sVar10 = b->entries;
                lVar8 = lVar6;
              }
              lVar4 = lVar4 + 1;
            } while (lVar8 < (long)sVar10);
          }
        }
        else {
          if ((int)lVar4 != 0) goto LAB_001d8fb8;
          lVar5 = oggpack_read(opb,1);
          lVar4 = b->entries;
          lVar8 = opb->storage;
          lVar6 = oggpack_bytes(opb);
          if (lVar8 - lVar6 < (long)(((ulong)(lVar5 == 0) * 4 + 1) * lVar4 + 7) >> 3)
          goto LAB_001d8fb8;
          sVar10 = b->entries;
          pcVar7 = (char *)malloc(sVar10);
          b->lengthlist = pcVar7;
          if (lVar5 == 0) {
            if (0 < (long)sVar10) {
              lVar4 = 0;
              do {
                lVar8 = oggpack_read(opb,5);
                if (lVar8 == -1) goto LAB_001d8fb8;
                b->lengthlist[lVar4] = (char)lVar8 + '\x01';
                lVar4 = lVar4 + 1;
              } while (lVar4 < b->entries);
            }
          }
          else if (0 < (long)sVar10) {
            lVar4 = 0;
            do {
              lVar8 = oggpack_read(opb,1);
              if (lVar8 == 0) {
                cVar1 = '\0';
              }
              else {
                lVar8 = oggpack_read(opb,5);
                if (lVar8 == -1) goto LAB_001d8fb8;
                cVar1 = (char)lVar8 + '\x01';
              }
              b->lengthlist[lVar4] = cVar1;
              lVar4 = lVar4 + 1;
            } while (lVar4 < b->entries);
          }
        }
        lVar4 = oggpack_read(opb,4);
        iVar2 = (int)lVar4;
        b->maptype = iVar2;
        if (iVar2 - 1U < 2) {
          lVar4 = oggpack_read(opb,0x20);
          b->q_min = lVar4;
          lVar4 = oggpack_read(opb,0x20);
          b->q_delta = lVar4;
          lVar4 = oggpack_read(opb,4);
          b->q_quant = (int)lVar4 + 1;
          lVar4 = oggpack_read(opb,1);
          b->q_sequencep = (int)lVar4;
          if ((int)lVar4 != -1) {
            if (b->maptype == 2) {
              iVar2 = (int)b->dim * (int)b->entries;
            }
            else {
              iVar2 = 0;
              if ((b->maptype == 1) && (b->dim != 0)) {
                lVar4 = _book_maptype1_quantvals(b);
                iVar2 = (int)lVar4;
              }
            }
            iVar3 = b->q_quant;
            lVar4 = opb->storage;
            lVar8 = oggpack_bytes(opb);
            if ((long)(iVar3 * iVar2 + 7 >> 3) <= lVar4 - lVar8) {
              lVar4 = (long)iVar2;
              plVar9 = (long *)malloc(lVar4 * 8);
              b->quantlist = plVar9;
              if (0 < iVar2) {
                lVar8 = 0;
                do {
                  lVar5 = oggpack_read(opb,b->q_quant);
                  plVar9 = b->quantlist;
                  plVar9[lVar8] = lVar5;
                  lVar8 = lVar8 + 1;
                } while (lVar4 != lVar8);
              }
              if (iVar2 == 0) {
                return b;
              }
              if (plVar9[lVar4 + -1] != -1) {
                return b;
              }
            }
          }
        }
        else if (iVar2 == 0) {
          return b;
        }
      }
    }
  }
LAB_001d8fb8:
  vorbis_staticbook_destroy(b);
  return (static_codebook *)0x0;
}

Assistant:

static_codebook *vorbis_staticbook_unpack(oggpack_buffer *opb){
  long i,j;
  static_codebook *s=_ogg_calloc(1,sizeof(*s));
  s->allocedp=1;

  /* make sure alignment is correct */
  if(oggpack_read(opb,24)!=0x564342)goto _eofout;

  /* first the basic parameters */
  s->dim=oggpack_read(opb,16);
  s->entries=oggpack_read(opb,24);
  if(s->entries==-1)goto _eofout;

  if(ov_ilog(s->dim)+ov_ilog(s->entries)>24)goto _eofout;

  /* codeword ordering.... length ordered or unordered? */
  switch((int)oggpack_read(opb,1)){
  case 0:{
    long unused;
    /* allocated but unused entries? */
    unused=oggpack_read(opb,1);
    if((s->entries*(unused?1:5)+7)>>3>opb->storage-oggpack_bytes(opb))
      goto _eofout;
    /* unordered */
    s->lengthlist=_ogg_malloc(sizeof(*s->lengthlist)*s->entries);

    /* allocated but unused entries? */
    if(unused){
      /* yes, unused entries */

      for(i=0;i<s->entries;i++){
        if(oggpack_read(opb,1)){
          long num=oggpack_read(opb,5);
          if(num==-1)goto _eofout;
          s->lengthlist[i]=num+1;
        }else
          s->lengthlist[i]=0;
      }
    }else{
      /* all entries used; no tagging */
      for(i=0;i<s->entries;i++){
        long num=oggpack_read(opb,5);
        if(num==-1)goto _eofout;
        s->lengthlist[i]=num+1;
      }
    }

    break;
  }
  case 1:
    /* ordered */
    {
      long length=oggpack_read(opb,5)+1;
      if(length==0)goto _eofout;
      s->lengthlist=_ogg_malloc(sizeof(*s->lengthlist)*s->entries);

      for(i=0;i<s->entries;){
        long num=oggpack_read(opb,ov_ilog(s->entries-i));
        if(num==-1)goto _eofout;
        if(length>32 || num>s->entries-i ||
           (num>0 && (num-1)>>(length-1)>1)){
          goto _errout;
        }
        if(length>32)goto _errout;
        for(j=0;j<num;j++,i++)
          s->lengthlist[i]=length;
        length++;
      }
    }
    break;
  default:
    /* EOF */
    goto _eofout;
  }

  /* Do we have a mapping to unpack? */
  switch((s->maptype=oggpack_read(opb,4))){
  case 0:
    /* no mapping */
    break;
  case 1: case 2:
    /* implicitly populated value mapping */
    /* explicitly populated value mapping */

    s->q_min=oggpack_read(opb,32);
    s->q_delta=oggpack_read(opb,32);
    s->q_quant=oggpack_read(opb,4)+1;
    s->q_sequencep=oggpack_read(opb,1);
    if(s->q_sequencep==-1)goto _eofout;

    {
      int quantvals=0;
      switch(s->maptype){
      case 1:
        quantvals=(s->dim==0?0:_book_maptype1_quantvals(s));
        break;
      case 2:
        quantvals=s->entries*s->dim;
        break;
      }

      /* quantized values */
      if(((quantvals*s->q_quant+7)>>3)>opb->storage-oggpack_bytes(opb))
        goto _eofout;
      s->quantlist=_ogg_malloc(sizeof(*s->quantlist)*quantvals);
      for(i=0;i<quantvals;i++)
        s->quantlist[i]=oggpack_read(opb,s->q_quant);

      if(quantvals&&s->quantlist[quantvals-1]==-1)goto _eofout;
    }
    break;
  default:
    goto _errout;
  }

  /* all set */
  return(s);

 _errout:
 _eofout:
  vorbis_staticbook_destroy(s);
  return(NULL);
}